

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O3

int ogg_stream_pageout_fill(ogg_stream_state *os,ogg_page *og,int nfill)

{
  uchar *puVar1;
  long lVar2;
  uint *__dest;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((os == (ogg_stream_state *)0x0) || (os->body_data == (uchar *)0x0)) {
    return 0;
  }
  if (os->e_o_s != 0) {
    if (os->lacing_fill == 0) {
      iVar5 = ogg_stream_flush_i(os,og,0,nfill);
      return iVar5;
    }
LAB_001e5813:
    iVar5 = ogg_stream_flush_i(os,og,1,nfill);
    return iVar5;
  }
  bVar14 = false;
  if ((os->lacing_fill != 0) && (os->b_o_s == 0)) goto LAB_001e5813;
  bVar3 = false;
  puVar1 = os->body_data;
  lVar2 = os->lacing_fill;
  lVar6 = 0xff;
  if (lVar2 < 0xff) {
    lVar6 = lVar2;
  }
  uVar10 = (uint)lVar6;
  if (uVar10 == 0 || puVar1 == (uchar *)0x0) {
    return 0;
  }
  iVar5 = os->b_o_s;
  if (iVar5 == 0) {
    if ((int)uVar10 < 1) {
      uVar10 = 0;
    }
    else {
      uVar13 = 0;
      do {
        if ((char)os->lacing_vals[uVar13] != -1) {
          uVar10 = (int)uVar13 + 1;
          lVar6 = 0;
          goto LAB_001e5624;
        }
        uVar13 = uVar13 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar13);
    }
    lVar6 = 0;
    bVar3 = bVar14;
  }
  else if ((int)uVar10 < 1) {
    lVar6 = -1;
    uVar10 = 0;
    bVar3 = bVar14;
  }
  else {
    lVar6 = -1;
    uVar13 = 0;
    iVar12 = 0;
    iVar7 = 0;
    lVar11 = 0;
    do {
      if ((nfill < lVar11) && (3 < iVar12)) {
        bVar14 = true;
        uVar10 = (uint)uVar13;
        break;
      }
      iVar12 = 0;
      if ((ulong)*(byte *)(os->lacing_vals + uVar13) != 0xff) {
        lVar6 = os->granule_vals[uVar13];
        iVar7 = iVar7 + 1;
        iVar12 = iVar7;
      }
      lVar11 = lVar11 + (ulong)*(byte *)(os->lacing_vals + uVar13);
      uVar13 = uVar13 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar13);
    uVar9 = 0xff;
    bVar3 = bVar14;
    if (uVar10 == 0xff) goto LAB_001e5630;
  }
LAB_001e5624:
  uVar9 = uVar10;
  if (!bVar3) {
    return 0;
  }
LAB_001e5630:
  builtin_memcpy(os->header,"OggS",5);
  os->header[5] = '\0';
  __dest = (uint *)os->lacing_vals;
  bVar14 = (*__dest >> 8 & 1) == 0;
  bVar4 = bVar14 + 2;
  if (iVar5 != 0) {
    bVar4 = bVar14;
  }
  os->header[5] = bVar4;
  lVar11 = (long)(int)uVar9;
  if ((os->e_o_s != 0) && (lVar2 == lVar11)) {
    os->header[5] = bVar4 | 4;
  }
  os->b_o_s = 1;
  lVar8 = 0;
  do {
    os->header[lVar8 + 6] = (uchar)lVar6;
    lVar6 = lVar6 >> 8;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  lVar6 = os->serialno;
  lVar8 = 0;
  do {
    os->header[lVar8 + 0xe] = (uchar)lVar6;
    lVar6 = lVar6 >> 8;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  lVar8 = 0;
  lVar6 = os->pageno;
  if (os->pageno == -1) {
    lVar6 = lVar8;
  }
  os->pageno = lVar6 + 1;
  do {
    os->header[lVar8 + 0x12] = (uchar)lVar6;
    lVar6 = lVar6 >> 8;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  os->header[0x16] = '\0';
  os->header[0x17] = '\0';
  os->header[0x18] = '\0';
  os->header[0x19] = '\0';
  os->header[0x1a] = (uchar)uVar9;
  uVar13 = 0;
  if (0 < (int)uVar9) {
    lVar6 = 0;
    do {
      uVar10 = __dest[lVar6];
      os->header[lVar6 + 0x1b] = (uchar)uVar10;
      uVar10 = (int)uVar13 + (uVar10 & 0xff);
      uVar13 = (ulong)uVar10;
      lVar6 = lVar6 + 1;
    } while (lVar11 != lVar6);
    uVar13 = (ulong)uVar10;
  }
  og->header = os->header;
  os->header_fill = uVar9 + 0x1b;
  og->header_len = (long)(int)(uVar9 + 0x1b);
  og->body = puVar1 + os->body_returned;
  og->body_len = uVar13;
  os->lacing_fill = lVar2 - lVar11;
  memmove(__dest,__dest + lVar11,(lVar2 - lVar11) * 4);
  memmove(os->granule_vals,os->granule_vals + lVar11,os->lacing_fill << 3);
  os->body_returned = os->body_returned + uVar13;
  ogg_page_checksum_set(og);
  return 1;
}

Assistant:

int ogg_stream_pageout_fill(ogg_stream_state *os, ogg_page *og, int nfill){
  int force=0;
  if(ogg_stream_check(os)) return 0;

  if((os->e_o_s&&os->lacing_fill) ||          /* 'were done, now flush' case */
     (os->lacing_fill&&!os->b_o_s))           /* 'initial header page' case */
    force=1;

  return(ogg_stream_flush_i(os,og,force,nfill));
}